

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O0

void __thiscall
QUnhandledException::QUnhandledException(QUnhandledException *this,QUnhandledException *other)

{
  long lVar1;
  QSharedDataPointer<QUnhandledExceptionPrivate> *in_RDI;
  long in_FS_OFFSET;
  QSharedDataPointer<QUnhandledExceptionPrivate> *__obj;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QException::QException((QException *)in_RDI);
  (in_RDI->d).ptr = (QUnhandledExceptionPrivate *)&PTR__QUnhandledException_00bea6c8;
  __obj = in_RDI + 1;
  QSharedDataPointer<QUnhandledExceptionPrivate>::QSharedDataPointer
            ((QSharedDataPointer<QUnhandledExceptionPrivate> *)0x6da558);
  std::
  exchange<QSharedDataPointer<QUnhandledExceptionPrivate>,QSharedDataPointer<QUnhandledExceptionPrivate>>
            (__obj,in_RDI);
  QSharedDataPointer<QUnhandledExceptionPrivate>::~QSharedDataPointer(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUnhandledException::QUnhandledException(QUnhandledException &&other) noexcept
    : d(std::exchange(other.d, {}))
{
}